

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O1

long text_subtitles::TextToPGSConverter::writePGHeader(uint8_t *buff,int64_t pts,int64_t dts)

{
  uint32_t uVar1;
  
  buff[0] = 'P';
  buff[1] = 'G';
  uVar1 = my_ntohl((uint32_t)pts);
  *(uint32_t *)(buff + 2) = uVar1;
  uVar1 = 0;
  if (dts < pts) {
    uVar1 = my_ntohl((uint32_t)dts);
  }
  *(uint32_t *)(buff + 6) = uVar1;
  return 10;
}

Assistant:

long TextToPGSConverter::writePGHeader(uint8_t* buff, const int64_t pts, int64_t dts)
{
    if (dts > pts)
        dts = pts;
    *buff++ = 'P';
    *buff++ = 'G';
    auto data = reinterpret_cast<uint32_t*>(buff);
    *data++ = my_htonl(static_cast<uint32_t>(pts));
    if (dts != pts)
        *data = my_htonl(static_cast<uint32_t>(dts));
    else
        *data = 0;
    return 10;
}